

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWRepository.cxx
# Opt level: O3

void __thiscall cmCPackIFWRepository::cmCPackIFWRepository(cmCPackIFWRepository *this)

{
  cmCPackIFWCommon::cmCPackIFWCommon(&this->super_cmCPackIFWCommon);
  (this->Name)._M_dataplus._M_p = (pointer)&(this->Name).field_2;
  (this->Name)._M_string_length = 0;
  (this->Name).field_2._M_local_buf[0] = '\0';
  this->Update = None;
  (this->Url)._M_dataplus._M_p = (pointer)&(this->Url).field_2;
  (this->Url)._M_string_length = 0;
  (this->Url).field_2._M_local_buf[0] = '\0';
  (this->OldUrl)._M_dataplus._M_p = (pointer)&(this->OldUrl).field_2;
  (this->OldUrl)._M_string_length = 0;
  (this->OldUrl).field_2._M_local_buf[0] = '\0';
  (this->NewUrl)._M_dataplus._M_p = (pointer)&(this->NewUrl).field_2;
  (this->NewUrl)._M_string_length = 0;
  (this->NewUrl).field_2._M_local_buf[0] = '\0';
  (this->Enabled)._M_dataplus._M_p = (pointer)&(this->Enabled).field_2;
  (this->Enabled)._M_string_length = 0;
  (this->Enabled).field_2._M_local_buf[0] = '\0';
  (this->Username)._M_dataplus._M_p = (pointer)&(this->Username).field_2;
  (this->Username)._M_string_length = 0;
  (this->Username).field_2._M_local_buf[0] = '\0';
  (this->Password)._M_dataplus._M_p = (pointer)&(this->Password).field_2;
  (this->Password)._M_string_length = 0;
  (this->Password).field_2._M_local_buf[0] = '\0';
  (this->DisplayName)._M_dataplus._M_p = (pointer)&(this->DisplayName).field_2;
  (this->DisplayName)._M_string_length = 0;
  (this->DisplayName).field_2._M_local_buf[0] = '\0';
  (this->RepositoryUpdate).
  super__Vector_base<cmCPackIFWRepository_*,_std::allocator<cmCPackIFWRepository_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->RepositoryUpdate).
  super__Vector_base<cmCPackIFWRepository_*,_std::allocator<cmCPackIFWRepository_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->RepositoryUpdate).
  super__Vector_base<cmCPackIFWRepository_*,_std::allocator<cmCPackIFWRepository_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Directory)._M_dataplus._M_p = (pointer)&(this->Directory).field_2;
  (this->Directory)._M_string_length = 0;
  (this->Directory).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

cmCPackIFWRepository::cmCPackIFWRepository()
  : Update(cmCPackIFWRepository::None)
{
}